

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalException.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::ApprovalMismatchException::format
          (ApprovalMismatchException *this,string *received,string *approved)

{
  ostream *poVar1;
  string *in_RCX;
  string *in_RDX;
  string *in_RDI;
  stringstream s;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  string *local_20;
  string *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = ::std::operator<<(local_198,"Failed Approval: \n");
  poVar1 = ::std::operator<<(poVar1,"Received does not match approved \n");
  poVar1 = ::std::operator<<(poVar1,"Received : \"");
  poVar1 = ::std::operator<<(poVar1,local_18);
  poVar1 = ::std::operator<<(poVar1,"\" \n");
  poVar1 = ::std::operator<<(poVar1,"Approved : \"");
  poVar1 = ::std::operator<<(poVar1,local_20);
  ::std::operator<<(poVar1,"\"");
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return in_RDI;
}

Assistant:

std::string ApprovalMismatchException::format(const std::string& received,
                                                  const std::string& approved)
    {
        std::stringstream s;
        s << "Failed Approval: \n"
          << "Received does not match approved \n"
          << "Received : \"" << received << "\" \n"
          << "Approved : \"" << approved << "\"";
        return s.str();
    }